

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdAlphaBlend(int dst,int src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = (uint)src >> 0x18 & 0x7f;
  iVar4 = src;
  if (((uVar3 != 0) && (iVar4 = dst, uVar3 != 0x7f)) &&
     (uVar6 = (uint)dst >> 0x18 & 0x7f, iVar4 = src, uVar6 != 0x7f)) {
    uVar5 = uVar3 ^ 0x7f;
    uVar2 = ((uVar6 ^ 0x7f) * uVar3) / 0x7f;
    uVar1 = uVar2 + uVar5;
    iVar4 = ((((uint)dst >> 8 & 0xff) * uVar2 + ((uint)src >> 8 & 0xff) * uVar5 & 0xffff) / uVar1) *
            0x100 + ((((uint)dst >> 0x10 & 0xff) * uVar2 + ((uint)src >> 0x10 & 0xff) * uVar5 &
                     0xffff) / uVar1) * 0x10000 + ((uVar3 * uVar6) / 0x7f) * 0x1000000 +
            ((dst & 0xffU) * uVar2 + (src & 0xffU) * uVar5 & 0xffff) / uVar1;
  }
  return iVar4;
}

Assistant:

BGD_DECLARE(int) gdAlphaBlend (int dst, int src)
{
	int src_alpha = gdTrueColorGetAlpha(src);
	int dst_alpha, alpha, red, green, blue;
	int src_weight, dst_weight, tot_weight;

	/* -------------------------------------------------------------------- */
	/*      Simple cases we want to handle fast.                            */
	/* -------------------------------------------------------------------- */
	if( src_alpha == gdAlphaOpaque )
		return src;

	dst_alpha = gdTrueColorGetAlpha(dst);
	if( src_alpha == gdAlphaTransparent )
		return dst;
	if( dst_alpha == gdAlphaTransparent )
		return src;

	/* -------------------------------------------------------------------- */
	/*      What will the source and destination alphas be?  Note that      */
	/*      the destination weighting is substantially reduced as the       */
	/*      overlay becomes quite opaque.                                   */
	/* -------------------------------------------------------------------- */
	src_weight = gdAlphaTransparent - src_alpha;
	dst_weight = (gdAlphaTransparent - dst_alpha) * src_alpha / gdAlphaMax;
	tot_weight = src_weight + dst_weight;

	/* -------------------------------------------------------------------- */
	/*      What red, green and blue result values will we use?             */
	/* -------------------------------------------------------------------- */
	alpha = src_alpha * dst_alpha / gdAlphaMax;

	red = (gdTrueColorGetRed(src) * src_weight
	       + gdTrueColorGetRed(dst) * dst_weight) / tot_weight;
	green = (gdTrueColorGetGreen(src) * src_weight
	         + gdTrueColorGetGreen(dst) * dst_weight) / tot_weight;
	blue = (gdTrueColorGetBlue(src) * src_weight
	        + gdTrueColorGetBlue(dst) * dst_weight) / tot_weight;

	/* -------------------------------------------------------------------- */
	/*      Return merged result.                                           */
	/* -------------------------------------------------------------------- */
	return ((alpha << 24) + (red << 16) + (green << 8) + blue);
}